

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5PoslistNext64(u8 *a,int n,int *pi,i64 *piOff)

{
  byte bVar1;
  undefined4 in_EAX;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  i64 iVar6;
  int iVar7;
  undefined4 uStack_38;
  int iVal;
  
  iVar7 = *pi;
  if (iVar7 < n) {
    iVar6 = *piOff;
    bVar1 = a[iVar7];
    _uStack_38 = (ulong)CONCAT14(bVar1,in_EAX);
    if ((char)bVar1 < '\0') {
      iVar2 = sqlite3Fts5GetVarint32(a + iVar7,(u32 *)&iVal);
      uVar3 = iVal;
    }
    else {
      iVar2 = 1;
      uVar3 = (uint)bVar1;
    }
    iVar7 = iVar7 + iVar2;
    if (uVar3 == 1) {
      bVar1 = a[iVar7];
      uVar5 = (ulong)bVar1;
      _uStack_38 = (ulong)CONCAT14(bVar1,uStack_38);
      if ((char)bVar1 < '\0') {
        iVar2 = sqlite3Fts5GetVarint32(a + iVar7,(u32 *)&iVal);
        uVar5 = _uStack_38 >> 0x20;
      }
      else {
        iVar2 = 1;
      }
      iVar4 = iVar2 + iVar7;
      iVar6 = uVar5 << 0x20;
      bVar1 = a[iVar4];
      _uStack_38 = (ulong)CONCAT14(bVar1,uStack_38);
      if ((char)bVar1 < '\0') {
        iVar7 = sqlite3Fts5GetVarint32(a + iVar4,(u32 *)&iVal);
        iVar7 = iVar4 + iVar7;
        uVar3 = iVal;
      }
      else {
        iVar7 = iVar7 + iVar2 + 1;
        uVar3 = (uint)bVar1;
      }
    }
    *piOff = (ulong)(uVar3 + 0x7ffffffe & 0x7fffffff) + iVar6;
    *pi = iVar7;
    iVar7 = 0;
  }
  else {
    *piOff = -1;
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

static int sqlite3Fts5PoslistNext64(
  const u8 *a, int n,             /* Buffer containing poslist */
  int *pi,                        /* IN/OUT: Offset within a[] */
  i64 *piOff                      /* IN/OUT: Current offset */
){
  int i = *pi;
  if( i>=n ){
    /* EOF */
    *piOff = -1;
    return 1;  
  }else{
    i64 iOff = *piOff;
    int iVal;
    fts5FastGetVarint32(a, i, iVal);
    if( iVal==1 ){
      fts5FastGetVarint32(a, i, iVal);
      iOff = ((i64)iVal) << 32;
      fts5FastGetVarint32(a, i, iVal);
    }
    *piOff = iOff + ((iVal-2) & 0x7FFFFFFF);
    *pi = i;
    return 0;
  }
}